

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O3

ConsCell * find_close_cell(conspage *page,LispPTR oldcell)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0;
  uVar3 = *(uint *)&page->field_0x8 >> 0x10 & 0xff;
  if (uVar3 == 0) {
    return (ConsCell *)0x0;
  }
  uVar4 = oldcell & 0xff;
  uVar2 = uVar3;
  if (uVar4 + 0xe < uVar3 || uVar3 <= uVar4) {
    do {
      uVar3 = *(uint *)((long)&page->cell6 + (ulong)uVar2 * 2);
      if (uVar3 < 0x1000000) {
        return (ConsCell *)0x0;
      }
      uVar3 = uVar3 >> 0x18;
      uVar1 = (ulong)uVar2;
      uVar2 = uVar3;
    } while (uVar4 + 0xe < uVar3 || uVar3 <= uVar4);
  }
  uVar2 = *(uint *)((long)&page->cell6 + (ulong)uVar3 * 2);
  if ((int)uVar1 == 0) {
    uVar2 = *(uint *)&page->field_0x8 & 0xff00ffff | uVar2 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&page->cell6 + uVar1 * 2 + 3) = (char)(uVar2 >> 0x18);
    uVar2 = *(uint *)&page->field_0x8;
  }
  *(uint *)&page->field_0x8 = uVar2 - 0x1000000;
  return (ConsCell *)((long)&page->cell6 + (ulong)uVar3 * 2);
}

Assistant:

static ConsCell *find_close_cell(struct conspage *page, LispPTR oldcell) {
  unsigned oldoffset = oldcell & 0xFF;
  unsigned offset = page->next_cell;
  unsigned prior = 0;

  while (offset) {
    if ((offset > oldoffset) && (offset <= (oldoffset + 14))) {
      if (prior)
        ((freecons *)((DLword *)page + prior))->next_free =
            ((freecons *)((DLword *)page + offset))->next_free;
      else
        page->next_cell = ((freecons *)((DLword *)page + offset))->next_free;
      page->count -= 1;
      return (ConsCell *)((DLword *)page + offset);
    }

    prior = offset;
    offset = ((freecons *)((DLword *)page + offset))->next_free;
  }
  return ((ConsCell *)0); /* No cell close enough */
}